

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

void to_vector(string *s,string *sep,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *l)

{
  ulong uVar1;
  string _s;
  string sub_str;
  allocator<char> local_50 [32];
  
  std::__cxx11::string::string((string *)&_s,(string *)s);
  if (_s._M_string_length == 0) {
LAB_00105722:
    std::__cxx11::string::~string((string *)&_s);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sub_str,anon_var_dwarf_3438 + 0xc,local_50);
  uVar1 = std::__cxx11::string::find((string *)s,(ulong)sep);
LAB_00105687:
  if (uVar1 != 0) {
    if (uVar1 == 0xffffffffffffffff) {
      if (_s._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(l,&_s);
      }
LAB_00105718:
      std::__cxx11::string::~string((string *)&sub_str);
      goto LAB_00105722;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&_s);
    std::__cxx11::string::operator=((string *)&sub_str,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(l,&sub_str);
  }
  if (_s._M_string_length <= uVar1) goto LAB_00105718;
  std::__cxx11::string::substr((ulong)local_50,(ulong)&_s);
  std::__cxx11::string::operator=((string *)&_s,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  uVar1 = std::__cxx11::string::find((string *)&_s,(ulong)sep);
  goto LAB_00105687;
}

Assistant:

void to_vector(
    const std::string &s, const std::string &sep, std::vector<std::string> &l) {
    std::string _s(s);

  if ( _s.empty() ) return;

  size_t found;
  std::string sub_str = "";

  found = s.find(sep);

  while (found != std::string::npos) {
    /*跳过空值，比如abcd,123456,,8909
     * * 按照逗号分隔，会有空值,found=0*/
    if (found > 0) {
      sub_str = _s.substr(0, found);
      l.push_back(sub_str);
    }

    if (found >= _s.size()) return;

    _s = _s.substr(found + sep.size());
    found = _s.find(sep);
  }

  if (_s.length() > 0) l.push_back(_s);
}